

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O3

long __thiscall gl4cts::BasicBufferOperations::Run(BasicBufferOperations *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  bool bVar1;
  undefined8 *puVar2;
  void *pvVar3;
  ulong uVar4;
  GLuint i;
  long lVar5;
  ulong uVar6;
  GLuint data [8];
  undefined8 local_60;
  uint local_58 [10];
  
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  buffers = &this->buffer_;
  glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->buffer_);
  lVar5 = 0;
  glu::CallLogWrapper::glBufferData(this_00,0x92c0,0x20,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->buffer_);
  puVar2 = (undefined8 *)glu::CallLogWrapper::glMapBuffer(this_00,0x92c0,0x88b9);
  *puVar2 = 0x100000000;
  puVar2[1] = 0x300000002;
  puVar2[2] = 0x500000004;
  puVar2[3] = 0x700000006;
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->buffer_);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x92c0,0,0x20,local_58);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
  bVar1 = true;
  do {
    lVar5 = lVar5 + 1;
    while (lVar5 - 1U == (ulong)*(uint *)((long)&local_60 + lVar5 * 4 + 4)) {
      lVar5 = lVar5 + 1;
      if (lVar5 == 9) {
        if (!bVar1) {
          return -1;
        }
        glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,*buffers);
        puVar2 = (undefined8 *)glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,0x20,2);
        *puVar2 = 0x200000000;
        puVar2[1] = 0x600000004;
        puVar2[2] = 0xa00000008;
        puVar2[3] = 0xe0000000c;
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
        local_60 = buffers;
        glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,*buffers);
        pvVar3 = glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,0x20,1);
        uVar4 = 0;
        uVar6 = 0;
        lVar5 = 0;
        do {
          if (uVar4 != *(uint *)((long)pvVar3 + uVar4 * 2)) {
            gl4cts::anon_unknown_0::Output
                      ("data[%u] is: %u should be: %u\n",uVar6,
                       (ulong)*(uint *)((long)local_58 + uVar4 * 2),uVar4 & 0xffffffff);
            lVar5 = -1;
          }
          uVar6 = (ulong)((int)uVar6 + 1);
          uVar4 = uVar4 + 2;
        } while (uVar4 != 0x10);
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,*local_60);
        local_58[0] = 0;
        local_58[1] = 3;
        local_58[2] = 6;
        local_58[3] = 9;
        local_58[4] = 0xc;
        local_58[5] = 0xf;
        local_58[6] = 0x12;
        local_58[7] = 0x15;
        glu::CallLogWrapper::glBufferSubData(this_00,0x92c0,0,0x20,local_58);
        local_58[4] = 0;
        local_58[5] = 0;
        local_58[6] = 0;
        local_58[7] = 0;
        local_58[0] = 0;
        local_58[1] = 0;
        local_58[2] = 0;
        local_58[3] = 0;
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x92c0,0,0x20,local_58);
        glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
        uVar6 = 0;
        uVar4 = 0;
        do {
          if (uVar6 != local_58[uVar4]) {
            gl4cts::anon_unknown_0::Output
                      ("data[%u] is: %u should be: %u\n",uVar4 & 0xffffffff,(ulong)local_58[uVar4],
                       uVar6 & 0xffffffff);
            lVar5 = -1;
          }
          uVar4 = uVar4 + 1;
          uVar6 = uVar6 + 3;
        } while (uVar4 != 8);
        return lVar5;
      }
    }
    bVar1 = false;
    gl4cts::anon_unknown_0::Output("data[%u] is: %u should be: %u\n",(ulong)((int)lVar5 - 1));
  } while (lVar5 != 8);
  return -1;
}

Assistant:

virtual long Run()
	{
		glGenBuffers(1, &buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 8 * 4, NULL, GL_STATIC_DRAW);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		GLuint* ptr = static_cast<GLuint*>(glMapBuffer(GL_ATOMIC_COUNTER_BUFFER, GL_WRITE_ONLY));
		for (GLuint i = 0; i < 8; ++i)
			ptr[i]	= i;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		long   res = NO_ERROR;
		GLuint data[8];
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		glGetBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(data), data);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);
		for (GLuint i = 0; i < 8; ++i)
		{
			if (data[i] != i)
			{
				Output("data[%u] is: %u should be: %u\n", i, data[i], i);
				res = ERROR;
			}
		}
		if (res != NO_ERROR)
			return res;

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		ptr = static_cast<GLuint*>(glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 32, GL_MAP_WRITE_BIT));
		for (GLuint i = 0; i < 8; ++i)
			ptr[i]	= i * 2;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		ptr = static_cast<GLuint*>(glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 32, GL_MAP_READ_BIT));
		for (GLuint i = 0; i < 8; ++i)
		{
			if (ptr[i] != i * 2)
			{
				Output("data[%u] is: %u should be: %u\n", i, data[i], i * 2);
				res = ERROR;
			}
		}
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		for (GLuint i = 0; i < 8; ++i)
			data[i]   = i * 3;
		glBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, 32, data);
		for (GLuint i = 0; i < 8; ++i)
			data[i]   = 0;
		glGetBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(data), data);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);
		for (GLuint i = 0; i < 8; ++i)
		{
			if (data[i] != i * 3)
			{
				Output("data[%u] is: %u should be: %u\n", i, data[i], i * 3);
				res = ERROR;
			}
		}

		return res;
	}